

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O3

uint8_t * __thiscall MPEGGOPHeader::deserialize(MPEGGOPHeader *this,uint8_t *buf,int64_t buf_size)

{
  bool bVar1;
  uint uVar2;
  BitStreamReader bitReader;
  BitStreamReader local_38;
  
  local_38.super_BitStream.m_totalBits = 0;
  local_38.super_BitStream.m_buffer = (uint *)0x0;
  local_38.super_BitStream.m_initBuffer = (uint *)0x0;
  local_38.m_curVal = 0;
  local_38.m_bitLeft = 0;
  BitStream::setBuffer(&local_38.super_BitStream,buf,buf + buf_size);
  local_38._24_8_ = local_38._24_8_ & 0xffffffff;
  local_38.m_curVal = BitStreamReader::getCurVal(&local_38,local_38.super_BitStream.m_buffer);
  local_38.m_bitLeft = 0x20;
  bVar1 = BitStreamReader::getBit(&local_38);
  this->drop_frame_flag = (uint)bVar1;
  uVar2 = BitStreamReader::getBits(&local_38,5);
  this->time_code_hours = (uint8_t)uVar2;
  uVar2 = BitStreamReader::getBits(&local_38,6);
  this->time_code_minutes = (uint8_t)uVar2;
  BitStreamReader::skipBit(&local_38);
  uVar2 = BitStreamReader::getBits(&local_38,6);
  this->time_code_seconds = (uint8_t)uVar2;
  uVar2 = BitStreamReader::getBits(&local_38,6);
  this->time_code_pictures = (uint8_t)uVar2;
  bVar1 = BitStreamReader::getBit(&local_38);
  this->close_gop = (uint)bVar1;
  bVar1 = BitStreamReader::getBit(&local_38);
  this->broken_link = (uint)bVar1;
  return (uint8_t *)
         ((long)((int)((((int)local_38.super_BitStream.m_buffer -
                        (int)local_38.super_BitStream.m_initBuffer) * 8 - local_38.m_bitLeft | 7) +
                      0x21) >> 3) + (long)local_38.super_BitStream.m_initBuffer);
}

Assistant:

uint8_t* MPEGGOPHeader::deserialize(uint8_t* buf, const int64_t buf_size)
{
    BitStreamReader bitReader{};
    bitReader.setBuffer(buf, buf + buf_size);

    drop_frame_flag = bitReader.getBit();

    time_code_hours = bitReader.getBits<uint8_t>(5);
    time_code_minutes = bitReader.getBits<uint8_t>(6);
    bitReader.skipBit();  // marker bit
    time_code_seconds = bitReader.getBits<uint8_t>(6);
    time_code_pictures = bitReader.getBits<uint8_t>(6);

    close_gop = bitReader.getBit();
    /*broken_link indicate that after editing the
      reference frames of the first B-Frames after GOP I-Frame
      are missing (open gop)*/
    broken_link = bitReader.getBit();

    return skipProcessedBytes(bitReader);
}